

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseTopLevelDeclContent(StructuralParser *this)

{
  bool bVar1;
  ProcessorBase *pPVar2;
  Namespace *parentNamespace;
  Graph *pGVar3;
  pool_ptr<soul::AST::Namespace> ns;
  pool_ptr<soul::AST::Graph> graph;
  pool_ptr<soul::AST::ProcessorBase> processor;
  CodeLocation keywordLocation_1;
  undefined1 local_d0 [16];
  CodeLocation keywordLocation;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  Scope local_48;
  UTF8Reader local_40;
  UTF8Reader local_38;
  
  parseSpecialisationParameters(this);
  local_38.data = (char *)(this->module).object;
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>
            ((soul *)&processor,(pool_ptr<soul::AST::ModuleBase> *)&stack0xffffffffffffffc8);
  local_40.data = (char *)(this->module).object;
  cast<soul::AST::Graph,soul::AST::ModuleBase>
            ((soul *)&graph,(pool_ptr<soul::AST::ModuleBase> *)&stack0xffffffffffffffc0);
  local_48._vptr_Scope = (_func_int **)(this->module).object;
  cast<soul::AST::Namespace,soul::AST::ModuleBase>
            ((soul *)&ns,(pool_ptr<soul::AST::ModuleBase> *)&stack0xffffffffffffffb8);
  if (processor.object != (ProcessorBase *)0x0) {
    pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator->(&processor);
    parseAnnotation(this,&pPVar2->annotation);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a351b);
  if (processor.object != (ProcessorBase *)0x0) {
    do {
      pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator*(&processor);
      bVar1 = parseEndpoint(this,pPVar2);
    } while (bVar1);
  }
  if (ns.object != (Namespace *)0x0) {
    parentNamespace = pool_ptr<soul::AST::Namespace>::operator*(&ns);
    parseImports(this,parentNamespace);
  }
LAB_0022ac07:
  while( true ) {
    while( true ) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a1eb4);
      if (bVar1) {
        giveErrorOnSemicolon(this);
        return;
      }
      if (graph.object != (Graph *)0x0) goto code_r0x0022ac22;
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c6756);
      if (!bVar1) break;
      parseStructDeclaration(this);
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x2c6bac);
    if (!bVar1) break;
    if (ns.object == (Namespace *)0x0) {
      Errors::graphMustBeInsideNamespace<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)&keywordLocation);
      CompileMessage::~CompileMessage((CompileMessage *)&keywordLocation);
    }
    keywordLocation.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (keywordLocation.sourceCode.object != (SourceCodeText *)0x0) {
      ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount =
           ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    keywordLocation.location.data = (this->super_SOULTokeniser).location.location.data;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    local_70._0_8_ = keywordLocation.sourceCode.object;
    if (keywordLocation.sourceCode.object != (SourceCodeText *)0x0) {
      ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount =
           ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_70._8_8_ = keywordLocation.location.data;
    pool_ptr<soul::AST::Namespace>::operator*(&ns);
    parseGraphDecl((StructuralParser *)&stack0xffffffffffffffb0,(CodeLocation *)this,
                   (Namespace *)local_70);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_70);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&keywordLocation);
  }
  goto LAB_0022ad2d;
code_r0x0022ac22:
  pGVar3 = pool_ptr<soul::AST::Graph>::operator*(&graph);
  bVar1 = parseProcessorInstanceList(this,pGVar3);
  if (!bVar1) {
    pGVar3 = pool_ptr<soul::AST::Graph>::operator*(&graph);
    bVar1 = parseConnectionList(this,pGVar3);
    if (!bVar1) {
LAB_0022ad2d:
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2c4fee);
      if (bVar1) {
        keywordLocation_1.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object
        ;
        if (keywordLocation_1.sourceCode.object != (SourceCodeText *)0x0) {
          ((keywordLocation_1.sourceCode.object)->super_RefCountedObject).refCount =
               ((keywordLocation_1.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        keywordLocation_1.location.data = (this->super_SOULTokeniser).location.location.data;
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&this->super_SOULTokeniser);
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x29da52);
        if (bVar1) {
          parseProcessorLatencyDeclaration(this);
        }
        else {
          if (ns.object == (Namespace *)0x0) {
            Errors::processorMustBeInsideNamespace<>();
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])
                      (this,(CompileMessage *)&keywordLocation);
            CompileMessage::~CompileMessage((CompileMessage *)&keywordLocation);
          }
          local_80._0_8_ = keywordLocation_1.sourceCode.object;
          if (keywordLocation_1.sourceCode.object != (SourceCodeText *)0x0) {
            ((keywordLocation_1.sourceCode.object)->super_RefCountedObject).refCount =
                 ((keywordLocation_1.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_80._8_8_ = keywordLocation_1.location.data;
          pool_ptr<soul::AST::Namespace>::operator*(&ns);
          parseProcessorDecl((StructuralParser *)(local_60 + 8),(CodeLocation *)this,
                             (Namespace *)local_80);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)local_80);
        }
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&keywordLocation_1.sourceCode);
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2a9d);
        if (bVar1) {
          parseUsingDeclaration(this);
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2a70);
          if (bVar1) {
            parseTopLevelLetOrVar(this,true);
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2a74);
            if (bVar1) {
              parseTopLevelLetOrVar(this,false);
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2aa3);
              if (bVar1) {
                parseEventFunction(this);
              }
              else {
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)0x2c4a69);
                if (bVar1) {
                  keywordLocation.sourceCode.object =
                       (this->super_SOULTokeniser).location.sourceCode.object;
                  if (keywordLocation.sourceCode.object != (SourceCodeText *)0x0) {
                    ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount =
                         ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
                  }
                  keywordLocation.location.data = (this->super_SOULTokeniser).location.location.data
                  ;
                  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::skip(&this->super_SOULTokeniser);
                  local_d0._0_8_ = keywordLocation.sourceCode.object;
                  if (keywordLocation.sourceCode.object != (SourceCodeText *)0x0) {
                    ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount =
                         ((keywordLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
                  }
                  local_d0._8_8_ = keywordLocation.location.data;
                  pool_ptr<soul::AST::ModuleBase>::operator*(&this->module);
                  parseNamespaceDecl((StructuralParser *)local_60,(CodeLocation *)this,
                                     (ModuleBase *)local_d0);
                  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                            ((RefCountedPtr<soul::SourceCodeText> *)local_d0);
                  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                            ((RefCountedPtr<soul::SourceCodeText> *)&keywordLocation);
                }
                else {
                  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          ::matchesAny<soul::TokenType,soul::TokenType>
                                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                                      *)this,(TokenType)0x29fc41,(TokenType)0x2c8374);
                  if (bVar1) {
                    if (ns.object == (Namespace *)0x0) {
                      Errors::endpointDeclsMustBeFirst<>();
                    }
                    else {
                      Errors::namespaceCannotContainEndpoints<>();
                    }
                    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])
                              (this,(CompileMessage *)&keywordLocation);
                    CompileMessage::~CompileMessage((CompileMessage *)&keywordLocation);
                  }
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a2ac2);
                  if (bVar1) {
                    Errors::importsMustBeAtStart<>();
                    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])
                              (this,(CompileMessage *)&keywordLocation);
                    CompileMessage::~CompileMessage((CompileMessage *)&keywordLocation);
                  }
                  parseFunctionOrStateVariable(this);
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0022ac07;
}

Assistant:

void parseTopLevelDeclContent()
    {
        parseSpecialisationParameters();

        auto processor = cast<AST::ProcessorBase> (module);
        auto graph     = cast<AST::Graph> (module);
        auto ns        = cast<AST::Namespace> (module);

        if (processor != nullptr)
            parseAnnotation (processor->annotation);

        expect (Operator::openBrace);

        if (processor != nullptr)
        {
            while (parseEndpoint (*processor))
            {}
        }

        if (ns != nullptr)
            parseImports (*ns);

        while (! matchIf (Operator::closeBrace))
        {
            if (graph != nullptr)
            {
                if (parseProcessorInstanceList (*graph)) continue;
                if (parseConnectionList (*graph))        continue;
            }
            else
            {
                if (matchIf (Keyword::struct_))         { parseStructDeclaration();  continue; }

                if (matches (Keyword::graph))
                {
                    if (ns == nullptr)
                        throwError (Errors::graphMustBeInsideNamespace());

                    auto keywordLocation = location;
                    skip();

                    parseGraphDecl (keywordLocation, *ns);
                    continue;
                }
            }

            if (matches (Keyword::processor))
            {
                auto keywordLocation = location;
                skip();

                if (matches (Operator::dot))
                {
                    parseProcessorLatencyDeclaration();
                    continue;
                }

                if (ns == nullptr)
                    throwError (Errors::processorMustBeInsideNamespace());

                parseProcessorDecl (keywordLocation, *ns);
                continue;
            }

            if (matchIf (Keyword::using_))          { parseUsingDeclaration();             continue; }
            if (matchIf (Keyword::let))             { parseTopLevelLetOrVar (true);        continue; }
            if (matchIf (Keyword::var))             { parseTopLevelLetOrVar (false);       continue; }
            if (matchIf (Keyword::event))           { parseEventFunction();                continue; }

            if (matches (Keyword::namespace_))
            {
                auto keywordLocation = location;
                skip();
                parseNamespaceDecl (keywordLocation, *module);
                continue;
            }

            if (matchesAny (Keyword::input, Keyword::output))
                throwError (ns != nullptr ? Errors::namespaceCannotContainEndpoints()
                                          : Errors::endpointDeclsMustBeFirst());

            if (matches (Keyword::import))
                throwError (Errors::importsMustBeAtStart());

            parseFunctionOrStateVariable();
        }

        giveErrorOnSemicolon();
    }